

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O2

bool jessilib::apply_cpp_escape_sequences<char8_t>
               (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                *inout_string)

{
  char cVar1;
  char8_t *pcVar2;
  char8_t *in_RDX;
  char8_t *extraout_RDX;
  ulong uVar3;
  ulong uVar4;
  char32_t *pcVar5;
  bool bVar6;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  decode_result dVar7;
  pointer local_48;
  jessilib *local_40;
  char8_t *local_38;
  
  local_40 = (jessilib *)inout_string->_M_string_length;
  if (local_40 == (jessilib *)0x0) {
    bVar6 = true;
  }
  else {
    local_48 = (inout_string->_M_dataplus)._M_p;
    local_38 = local_48;
    do {
      while( true ) {
        in_string._M_str = in_RDX;
        in_string._M_len = (size_t)local_38;
        dVar7 = decode_codepoint_utf8<char8_t>(local_40,in_string);
        in_RDX = (char8_t *)dVar7.units;
        bVar6 = in_RDX == (char8_t *)0x0;
        if (bVar6) goto LAB_001b5023;
        pcVar5 = L"\\";
        uVar4 = 1;
        while (uVar3 = uVar4, 0 < (long)uVar3) {
          uVar4 = uVar3 >> 1;
          if ((uint)pcVar5[uVar4 * 4] < (uint)dVar7.codepoint) {
            pcVar5 = pcVar5 + uVar4 * 4 + 4;
            uVar4 = ~uVar4 + uVar3;
          }
        }
        pcVar2 = in_RDX;
        if ((pcVar5 != L"\n") && (*pcVar5 == dVar7.codepoint)) break;
        while (pcVar2 != (char8_t *)0x0) {
          *local_48 = *local_38;
          local_48 = local_48 + 1;
          local_38 = local_38 + 1;
          pcVar2 = pcVar2 + -1;
        }
        local_40 = local_40 + -(long)in_RDX;
      }
      local_38 = local_38 + (long)in_RDX;
      local_40 = local_40 + -(long)in_RDX;
      cVar1 = (**(code **)(pcVar5 + 2))(&local_48,&local_40);
      in_RDX = extraout_RDX;
    } while (cVar1 != '\0');
LAB_001b5023:
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::erase
              (inout_string,(long)local_48 - (long)(inout_string->_M_dataplus)._M_p,
               0xffffffffffffffff);
  }
  return bVar6;
}

Assistant:

constexpr bool apply_cpp_escape_sequences(std::basic_string<CharT>& inout_string) {
	static_assert(is_sorted<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(), "Tree must be pre-sorted");
	static_assert(is_sorted<CharT, cpp_escapes_main_tree<CharT>, std::size(cpp_escapes_main_tree<CharT>)>(), "Tree must be pre-sorted");

	return apply_shrink_sequence_tree<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(inout_string);
}